

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_handshake.c
# Opt level: O2

int nn_ws_match_token(char *token,char **subj,int case_insensitive,int ignore_leading_sp)

{
  char cVar1;
  char cVar2;
  __int32_t **pp_Var3;
  char *pcVar4;
  
  if ((token == (char *)0x0) || (pcVar4 = *subj, pcVar4 == (char *)0x0)) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","token && *subj",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/ws_handshake.c"
            ,0x112);
    fflush(_stderr);
    nn_err_abort();
  }
  if (case_insensitive == 0) {
    for (; *token != '\0'; token = token + 1) {
      if (*token != *pcVar4) {
        return 0;
      }
      pcVar4 = pcVar4 + 1;
    }
  }
  else {
    for (; cVar1 = *token, (long)cVar1 != 0; token = token + 1) {
      cVar2 = *pcVar4;
      if ((long)cVar2 == 0) {
        return 0;
      }
      pp_Var3 = __ctype_tolower_loc();
      if ((*pp_Var3)[cVar1] != (*pp_Var3)[cVar2]) {
        return 0;
      }
      pcVar4 = pcVar4 + 1;
    }
  }
  *subj = pcVar4;
  return 1;
}

Assistant:

static int nn_ws_match_token (const char* token, const char **subj,
    int case_insensitive, int ignore_leading_sp)
{
    const char *pos;

    nn_assert (token && *subj);

    pos = *subj;

    if (ignore_leading_sp) {
        while (*pos == '\x20' && *pos) {
            pos++;
        }
    }

    if (case_insensitive) {
        while (*token && *pos) {
            if (tolower (*token) != tolower (*pos))
                return NN_WS_HANDSHAKE_NOMATCH;
            token++;
            pos++;
        }
    }
    else {
        while (*token && *pos) {
            if (*token != *pos)
                return NN_WS_HANDSHAKE_NOMATCH;
            token++;
            pos++;
        }
    }

    /*  Encountered end of subject before matching completed. */
    if (!*pos && *token)
        return NN_WS_HANDSHAKE_NOMATCH;

    /*  Entire token has been matched. */
    nn_assert (!*token);

    /*  On success, advance subject position. */
    *subj = pos;

    return NN_WS_HANDSHAKE_MATCH;
}